

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
          (TryAbsOperator *this,hugeint_t input)

{
  char cVar1;
  OutOfRangeException *this_00;
  hugeint_t hVar2;
  hugeint_t in_stack_ffffffffffffff88;
  hugeint_t input_local;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  input_local.upper = input.lower;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0x8000000000000000;
  input_local.lower = (uint64_t)this;
  cVar1 = duckdb::hugeint_t::operator==(&input_local,(hugeint_t *)&local_58);
  if (cVar1 == '\0') {
    hVar2 = AbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(in_stack_ffffffffffffff88);
    return hVar2;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_58,"Overflow on abs(%s)",(allocator *)&stack0xffffffffffffff97);
  duckdb::hugeint_t::ToString_abi_cxx11_();
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(this_00,&local_58,&local_38);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline hugeint_t TryAbsOperator::Operation(hugeint_t input) {
	if (input == NumericLimits<hugeint_t>::Minimum()) {
		throw OutOfRangeException("Overflow on abs(%s)", input.ToString());
	}
	return AbsOperator::Operation<hugeint_t, hugeint_t>(input);
}